

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::~cmake(cmake *this)

{
  cmCacheManager *this_00;
  cmState *this_01;
  cmVariableWatch *this_02;
  cmFileTimeComparison *this_03;
  cmake *this_local;
  
  this_00 = this->CacheManager;
  if (this_00 != (cmCacheManager *)0x0) {
    cmCacheManager::~cmCacheManager(this_00);
    operator_delete(this_00,0x40);
  }
  if (this->Policies != (cmPolicies *)0x0) {
    operator_delete(this->Policies,1);
  }
  this_01 = this->State;
  if (this_01 != (cmState *)0x0) {
    cmState::~cmState(this_01);
    operator_delete(this_01,0x188);
  }
  if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
    if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
    }
    this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  }
  cmDeleteAll<std::vector<cmGlobalGeneratorFactory*,std::allocator<cmGlobalGeneratorFactory*>>>
            (&this->Generators);
  this_02 = this->VariableWatch;
  if (this_02 != (cmVariableWatch *)0x0) {
    cmVariableWatch::~cmVariableWatch(this_02);
    operator_delete(this_02,0x30);
  }
  this_03 = this->FileComparison;
  if (this_03 != (cmFileTimeComparison *)0x0) {
    cmFileTimeComparison::~cmFileTimeComparison(this_03);
    operator_delete(this_03,8);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
  ::~map(&this->InstalledFiles);
  std::__cxx11::string::~string((string *)&this->GraphVizFile);
  std::__cxx11::string::~string((string *)&this->VSSolutionFile);
  std::__cxx11::string::~string((string *)&this->CheckStampList);
  std::__cxx11::string::~string((string *)&this->CheckStampFile);
  std::__cxx11::string::~string((string *)&this->CheckBuildSystemArgument);
  std::__cxx11::string::~string((string *)&this->CCEnvironment);
  std::__cxx11::string::~string((string *)&this->CXXEnvironment);
  std::__cxx11::string::~string((string *)&this->CMakeEditCommand);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map(&this->UsedCliVariables);
  std::__cxx11::string::~string((string *)&this->GeneratorToolset);
  std::__cxx11::string::~string((string *)&this->GeneratorPlatform);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>_>
  ::~map(&this->ExtraGenerators);
  std::vector<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>::~vector
            (&this->Generators);
  return;
}

Assistant:

cmake::~cmake()
{
  delete this->CacheManager;
  delete this->Policies;
  delete this->State;
  if (this->GlobalGenerator)
    {
    delete this->GlobalGenerator;
    this->GlobalGenerator = 0;
    }
  cmDeleteAll(this->Generators);
#ifdef CMAKE_BUILD_WITH_CMAKE
  delete this->VariableWatch;
#endif
  delete this->FileComparison;
}